

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O2

void duckdb::MinMaxNOperation::
     Finalize<duckdb::MinMaxNState<duckdb::MinMaxFallbackValue,duckdb::GreaterThan>>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  data_ptr_t pdVar1;
  UnaryAggregateHeap<duckdb::string_t,_duckdb::GreaterThan> *this;
  idx_t size;
  Vector *vector;
  HeapEntry<duckdb::string_t> *value;
  idx_t iVar2;
  idx_t iVar3;
  idx_t i_1;
  ulong uVar4;
  long lVar5;
  idx_t slot;
  ulong uVar6;
  UnifiedVectorFormat state_format;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(state_vector,count,&local_78);
  FlatVector::VerifyFlatVector(result);
  size = ListVector::GetListSize(result);
  lVar5 = 0;
  for (iVar2 = 0; count != iVar2; iVar2 = iVar2 + 1) {
    iVar3 = iVar2;
    if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
      iVar3 = (idx_t)(local_78.sel)->sel_vector[iVar2];
    }
    lVar5 = lVar5 + *(long *)(*(long *)(local_78.data + iVar3 * 8) + 0x10);
  }
  ListVector::Reserve(result,lVar5 + size);
  pdVar1 = result->data;
  vector = ListVector::GetEntry(result);
  for (uVar4 = 0; uVar4 != count; uVar4 = uVar4 + 1) {
    uVar6 = uVar4;
    if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
      uVar6 = (ulong)(local_78.sel)->sel_vector[uVar4];
    }
    this = *(UnaryAggregateHeap<duckdb::string_t,_duckdb::GreaterThan> **)
            (local_78.data + uVar6 * 8);
    if (((char)this[1].capacity == '\x01') && (iVar2 = this->size, iVar2 != 0)) {
      lVar5 = (uVar4 + offset) * 0x10;
      *(idx_t *)(pdVar1 + lVar5) = size;
      *(idx_t *)(pdVar1 + lVar5 + 8) = iVar2;
      value = UnaryAggregateHeap<duckdb::string_t,_duckdb::GreaterThan>::SortAndGetHeap(this);
      for (uVar6 = 0; iVar2 = size + uVar6, uVar6 < this->size; uVar6 = uVar6 + 1) {
        MinMaxFallbackValue::Assign(vector,iVar2,&value->value);
        value = value + 1;
      }
    }
    else {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,uVar4 + offset);
      iVar2 = size;
    }
    size = iVar2;
  }
  ListVector::SetListSize(result,size);
  Vector::Verify(result,count);
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  return;
}

Assistant:

static void Finalize(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count, idx_t offset) {

		UnifiedVectorFormat state_format;
		state_vector.ToUnifiedFormat(count, state_format);

		const auto states = UnifiedVectorFormat::GetData<STATE *>(state_format);
		auto &mask = FlatVector::Validity(result);

		const auto old_len = ListVector::GetListSize(result);

		// Count the number of new entries
		idx_t new_entries = 0;
		for (idx_t i = 0; i < count; i++) {
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];
			new_entries += state.heap.Size();
		}

		// Resize the list vector to fit the new entries
		ListVector::Reserve(result, old_len + new_entries);

		const auto list_entries = FlatVector::GetData<list_entry_t>(result);
		auto &child_data = ListVector::GetEntry(result);

		idx_t current_offset = old_len;
		for (idx_t i = 0; i < count; i++) {
			const auto rid = i + offset;
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];

			if (!state.is_initialized || state.heap.IsEmpty()) {
				mask.SetInvalid(rid);
				continue;
			}

			// Add the entries to the list vector
			auto &list_entry = list_entries[rid];
			list_entry.offset = current_offset;
			list_entry.length = state.heap.Size();

			// Turn the heap into a sorted list, invalidating the heap property
			auto heap = state.heap.SortAndGetHeap();

			for (idx_t slot = 0; slot < state.heap.Size(); slot++) {
				STATE::VAL_TYPE::Assign(child_data, current_offset++, state.heap.GetValue(heap[slot]));
			}
		}

		D_ASSERT(current_offset == old_len + new_entries);
		ListVector::SetListSize(result, current_offset);
		result.Verify(count);
	}